

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Compaction::IsBaseLevelForKey(Compaction *this,Slice *user_key)

{
  ulong uVar1;
  Comparator *pCVar2;
  Comparator *pCVar3;
  int iVar4;
  size_type sVar5;
  const_reference ppFVar6;
  Slice local_60;
  Slice local_50;
  value_type local_40;
  FileMetaData *f;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  Comparator *pCStack_28;
  int lvl;
  Comparator *user_cmp;
  Slice *user_key_local;
  Compaction *this_local;
  
  user_cmp = (Comparator *)user_key;
  user_key_local = (Slice *)this;
  pCStack_28 = InternalKeyComparator::user_comparator(&this->input_version_->vset_->icmp_);
  files._4_4_ = this->level_ + 2;
  do {
    if (6 < files._4_4_) {
      return true;
    }
    f = (FileMetaData *)(this->input_version_->files_ + files._4_4_);
    while (uVar1 = this->level_ptrs_[files._4_4_],
          sVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       f), uVar1 < sVar5) {
      ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)f,this->level_ptrs_[files._4_4_]);
      pCVar3 = user_cmp;
      pCVar2 = pCStack_28;
      local_40 = *ppFVar6;
      local_50 = InternalKey::user_key(&local_40->largest);
      iVar4 = (*pCVar2->_vptr_Comparator[2])(pCVar2,pCVar3,&local_50);
      pCVar3 = user_cmp;
      pCVar2 = pCStack_28;
      if (iVar4 < 1) {
        local_60 = InternalKey::user_key(&local_40->smallest);
        iVar4 = (*pCVar2->_vptr_Comparator[2])(pCVar2,pCVar3,&local_60);
        if (-1 < iVar4) {
          return false;
        }
        break;
      }
      this->level_ptrs_[files._4_4_] = this->level_ptrs_[files._4_4_] + 1;
    }
    files._4_4_ = files._4_4_ + 1;
  } while( true );
}

Assistant:

bool Compaction::IsBaseLevelForKey(const Slice& user_key) {
  // Maybe use binary search to find right entry instead of linear search?
  const Comparator* user_cmp = input_version_->vset_->icmp_.user_comparator();
  for (int lvl = level_ + 2; lvl < config::kNumLevels; lvl++) {
    const std::vector<FileMetaData*>& files = input_version_->files_[lvl];
    while (level_ptrs_[lvl] < files.size()) {
      FileMetaData* f = files[level_ptrs_[lvl]];
      if (user_cmp->Compare(user_key, f->largest.user_key()) <= 0) {
        // We've advanced far enough
        if (user_cmp->Compare(user_key, f->smallest.user_key()) >= 0) {
          // Key falls in this file's range, so definitely not base level
          return false;
        }
        break;
      }
      level_ptrs_[lvl]++;
    }
  }
  return true;
}